

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int in_ESI;
  uint *in_RDI;
  double in_XMM0_Qa;
  int i;
  int extra_zero;
  int exponent;
  bool unique_zero;
  int decimal_rep_length;
  char decimal_rep [121];
  int kDecimalRepCapacity;
  bool sign;
  int decimal_point;
  double in_stack_ffffffffffffff08;
  char c;
  StringBuilder *in_stack_ffffffffffffff10;
  StringBuilder *result_builder_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int iVar4;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar5;
  int in_stack_ffffffffffffff44;
  StringBuilder local_b8 [2];
  int *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  DtoaMode in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  byte local_35;
  int local_34 [6];
  int local_1c;
  double local_18;
  bool local_1;
  
  local_1c = in_ESI;
  local_18 = in_XMM0_Qa;
  Double::Double((Double *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  bVar1 = Double::IsSpecial((Double *)in_stack_ffffffffffffff10);
  if (bVar1) {
    local_1 = HandleSpecialValues((DoubleToStringConverter *)
                                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                  (double)in_RDI,
                                  (StringBuilder *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else if ((local_1c < 1) || (0x78 < local_1c)) {
    local_1 = false;
  }
  else {
    c = (char)((ulong)local_34 >> 0x38);
    DoubleToAscii(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                  in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff88,(int *)CONCAT44(0x79,in_stack_ffffffffffffffc0));
    bVar1 = (*in_RDI & 8) != 0;
    uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
    if (((local_35 & 1) != 0) && (((local_18 != 0.0 || (NAN(local_18))) || (!bVar1)))) {
      StringBuilder::AddCharacter(in_stack_ffffffffffffff10,c);
    }
    uVar2 = (uint)((*in_RDI & 4) != 0);
    iVar3 = in_stack_ffffffffffffff44;
    if (((int)in_RDI[9] < 1 - local_34[0]) ||
       ((int)in_RDI[10] < (int)((local_34[0] - local_1c) + uVar2))) {
      for (; iVar3 < local_1c; iVar3 = iVar3 + 1) {
        *(undefined1 *)((long)&local_b8[0].buffer_.start_ + (long)iVar3) = 0x30;
      }
      CreateExponentialRepresentation
                ((DoubleToStringConverter *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
                 (char *)CONCAT44(local_34[0] + -1,uVar2),iVar3,in_stack_ffffffffffffff30,
                 (StringBuilder *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    else {
      result_builder_00 = local_b8;
      iVar4 = 0;
      iVar3 = local_1c - local_34[0];
      std::max<int>((int *)&stack0xffffffffffffff30,(int *)&stack0xffffffffffffff2c);
      CreateDecimalRepresentation
                ((DoubleToStringConverter *)CONCAT44(in_stack_ffffffffffffff34,iVar4),
                 (char *)CONCAT44(iVar3,in_stack_ffffffffffffff28),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,local_34[0],result_builder_00);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  if ((-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_)) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}